

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-mock-test.cc
# Opt level: O1

void __thiscall LocaleTest_LocaleMock_Test::TestBody(LocaleTest_LocaleMock_Test *this)

{
  linked_ptr_internal *plVar1;
  LocaleMock *this_00;
  MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this_01;
  ScopedMock<LocaleMock> mock;
  Matcher<__locale_struct_*> local_268;
  undefined2 local_248;
  undefined1 *local_240;
  long local_238;
  undefined1 local_230 [16];
  Matcher<const_char_*> local_220;
  Matcher<int> local_208;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined2 local_1d0;
  StrictMock<LocaleMock> local_1c8;
  
  testing::StrictMock<LocaleMock>::StrictMock(&local_1c8);
  local_1c8._vptr_StrictMock = (_func_int **)&PTR__ScopedMock_00186550;
  this_00 = &local_1c8.super_LocaleMock;
  LocaleMock::instance = this_00;
  testing::Matcher<int>::Matcher(&local_208,0xde);
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"foo","");
  plVar1 = &local_268.super_MatcherBase<__locale_struct_*>.impl_.link_;
  local_268.super_MatcherBase<__locale_struct_*>._vptr_MatcherBase = (_func_int **)plVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_240,local_240 + local_238);
  local_248 = 0x101;
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f0,local_268.super_MatcherBase<__locale_struct_*>._vptr_MatcherBase,
             (undefined1 *)
             ((long)(linked_ptr_internal **)
                    local_268.super_MatcherBase<__locale_struct_*>._vptr_MatcherBase +
             (long)&((local_268.super_MatcherBase<__locale_struct_*>.impl_.value_)->
                    super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface));
  local_1d0 = local_248;
  if ((linked_ptr_internal *)local_268.super_MatcherBase<__locale_struct_*>._vptr_MatcherBase !=
      plVar1) {
    operator_delete(local_268.super_MatcherBase<__locale_struct_*>._vptr_MatcherBase);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_220,(PolymorphicMatcher *)local_1f0);
  testing::Matcher<__locale_struct_*>::Matcher(&local_268,(__locale_struct *)&DAT_0000000b);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,this_00);
  this_01 = testing::internal::
            FunctionMocker<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::With
                      (&this_00->gmock3_newlocale_453,&local_208,&local_220,&local_268);
  testing::internal::MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::
  InternalExpectedAt(this_01,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-mock-test.cc"
                     ,0x1fc,"mock","newlocale(222, StrEq(\"foo\"), locale)");
  local_268.super_MatcherBase<__locale_struct_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001862c8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<__locale_struct_*>_>::~linked_ptr
            (&local_268.super_MatcherBase<__locale_struct_*>.impl_);
  local_220.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00186260;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_220.super_MatcherBase<const_char_*>.impl_);
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0]);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  local_208.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001861f8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_208.super_MatcherBase<int>.impl_);
  newlocale(0xde,"foo",(__locale_t)&DAT_0000000b);
  local_1c8._vptr_StrictMock = (_func_int **)&PTR__ScopedMock_00186550;
  LocaleMock::instance = (LocaleMock *)0x0;
  testing::StrictMock<LocaleMock>::~StrictMock(&local_1c8);
  return;
}

Assistant:

TEST(LocaleTest, LocaleMock) {
  ScopedMock<LocaleMock> mock;
  LocaleType locale = reinterpret_cast<LocaleType>(11);
  EXPECT_CALL(mock, newlocale(222, StrEq("foo"), locale));
  newlocale(222, "foo", locale);
}